

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

int testing::internal::AppropriateResolution<double>(double val)

{
  undefined1 *puVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = -val;
  if (-val <= val) {
    dVar2 = val;
  }
  puVar1 = (undefined1 *)0x412e848000000000;
  if (1000000.0 <= dVar2) {
    if (10000000000.0 <= dVar2) {
      return 0x11;
    }
    if (1000000000.0 <= dVar2) {
      puVar1 = (undefined1 *)0x40c3880000000000;
    }
    else if (100000000.0 <= dVar2) {
      puVar1 = (undefined1 *)0x408f400000000000;
    }
    else if (10000000.0 <= dVar2) {
      puVar1 = (undefined1 *)0x4059000000000000;
    }
    else if (1000000.0 <= dVar2) {
      puVar1 = &DAT_4024000000000000;
    }
    else {
      puVar1 = (undefined1 *)0x3ff0000000000000;
    }
    dVar3 = (double)(int)(dVar2 / (double)puVar1 + 0.5) * (double)puVar1;
  }
  else {
    if (100000.0 <= dVar2) {
      puVar1 = (undefined1 *)0x3ff0000000000000;
    }
    else if (10000.0 <= dVar2) {
      puVar1 = &DAT_4024000000000000;
    }
    else if (1000.0 <= dVar2) {
      puVar1 = (undefined1 *)0x4059000000000000;
    }
    else if (100.0 <= dVar2) {
      puVar1 = (undefined1 *)0x408f400000000000;
    }
    else if (10.0 <= dVar2) {
      puVar1 = (undefined1 *)0x40c3880000000000;
    }
    else if (1.0 <= dVar2) {
      puVar1 = (undefined1 *)0x40f86a0000000000;
    }
    else if (dVar2 < 0.1) {
      if (0.01 <= dVar2) {
        puVar1 = (undefined1 *)0x416312d000000000;
      }
      else if (0.001 <= dVar2) {
        puVar1 = (undefined1 *)0x4197d78400000000;
      }
      else if (0.0001 <= dVar2) {
        puVar1 = (undefined1 *)0x41cdcd6500000000;
      }
      else {
        puVar1 = (undefined1 *)0x4202a05f20000000;
      }
    }
    dVar3 = (double)(int)(dVar2 * (double)puVar1 + 0.5) / (double)puVar1;
  }
  if ((dVar3 == dVar2) && (!NAN(dVar3) && !NAN(dVar2))) {
    return 6;
  }
  return 0x11;
}

Assistant:

int AppropriateResolution(FloatType val) {
  int full = std::numeric_limits<FloatType>::max_digits10;
  if (val < 0) val = -val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
  if (val < 1000000) {
    FloatType mulfor6 = 1e10;
    // Without these static casts, the template instantiation for float would
    // fail to compile when -Wdouble-promotion is enabled, as the arithmetic and
    // comparison logic would promote floats to doubles.
    if (val >= static_cast<FloatType>(100000.0)) {  // 100,000 to 999,999
      mulfor6 = 1.0;
    } else if (val >= static_cast<FloatType>(10000.0)) {
      mulfor6 = 1e1;
    } else if (val >= static_cast<FloatType>(1000.0)) {
      mulfor6 = 1e2;
    } else if (val >= static_cast<FloatType>(100.0)) {
      mulfor6 = 1e3;
    } else if (val >= static_cast<FloatType>(10.0)) {
      mulfor6 = 1e4;
    } else if (val >= static_cast<FloatType>(1.0)) {
      mulfor6 = 1e5;
    } else if (val >= static_cast<FloatType>(0.1)) {
      mulfor6 = 1e6;
    } else if (val >= static_cast<FloatType>(0.01)) {
      mulfor6 = 1e7;
    } else if (val >= static_cast<FloatType>(0.001)) {
      mulfor6 = 1e8;
    } else if (val >= static_cast<FloatType>(0.0001)) {
      mulfor6 = 1e9;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(
            val * mulfor6 + (static_cast<FloatType>(0.5)))) /
            mulfor6 ==
        val)
      return 6;
  } else if (val < static_cast<FloatType>(1e10)) {
    FloatType divfor6 = static_cast<FloatType>(1.0);
    if (val >= static_cast<FloatType>(1e9)) {  // 1,000,000,000 to 9,999,999,999
      divfor6 = 10000;
    } else if (val >=
               static_cast<FloatType>(1e8)) {  // 100,000,000 to 999,999,999
      divfor6 = 1000;
    } else if (val >=
               static_cast<FloatType>(1e7)) {  // 10,000,000 to 99,999,999
      divfor6 = 100;
    } else if (val >= static_cast<FloatType>(1e6)) {  // 1,000,000 to 9,999,999
      divfor6 = 10;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(
            val / divfor6 + (static_cast<FloatType>(0.5)))) *
            divfor6 ==
        val)
      return 6;
  }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
  return full;
}